

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

char * nifti_makeimgname(char *prefix,int nifti_type,int check,int comp)

{
  int iVar1;
  size_t sVar2;
  char *__dest;
  char *pcVar3;
  size_t sVar4;
  char *__src;
  char extgz [5];
  char extimg [5];
  char extnia [5];
  char exthdr [5];
  char extnii [5];
  char local_50 [8];
  undefined4 local_48;
  undefined1 local_44;
  char local_40 [8];
  char local_38 [8];
  char local_30 [8];
  
  builtin_strncpy(local_30,".nii",5);
  builtin_strncpy(local_38,".hdr",5);
  local_44 = 0;
  local_48 = 0x676d692e;
  builtin_strncpy(local_40,".nia",5);
  local_50[4] = 0;
  builtin_strncpy(local_50,".gz",4);
  iVar1 = nifti_validfilename(prefix);
  if (iVar1 == 0) {
    return (char *)0x0;
  }
  sVar2 = strlen(prefix);
  __dest = (char *)calloc(1,sVar2 + 8);
  if (__dest == (char *)0x0) {
    nifti_makeimgname_cold_2();
  }
  else {
    strcpy(__dest,prefix);
    pcVar3 = nifti_find_file_extension(__dest);
    if (pcVar3 == (char *)0x0) {
      if (nifti_type == 3) {
        __src = local_40;
      }
      else if (nifti_type == 1) {
        __src = local_30;
      }
      else {
        __src = (char *)&local_48;
      }
      strcat(__dest,__src);
    }
    else {
      iVar1 = is_uppercase(pcVar3);
      if (iVar1 != 0) {
        make_uppercase(local_30);
        make_uppercase(local_38);
        make_uppercase((char *)&local_48);
        make_uppercase(local_40);
        make_uppercase(local_50);
      }
      iVar1 = strncmp(pcVar3,local_38,4);
      if (iVar1 == 0) {
        sVar2 = strlen(__dest);
        sVar4 = strlen(pcVar3);
        *(undefined4 *)(__dest + (sVar2 - sVar4)) = local_48;
      }
    }
    if ((comp != 0) &&
       ((pcVar3 == (char *)0x0 || (pcVar3 = strstr(__dest,local_50), pcVar3 == (char *)0x0)))) {
      strcat(__dest,local_50);
    }
    if ((check == 0) || (iVar1 = nifti_fileexists(__dest), iVar1 == 0)) {
      if (g_opts_0 < 3) {
        return __dest;
      }
      fprintf(_stderr,"+d made image filename \'%s\'\n",__dest);
      return __dest;
    }
    nifti_makeimgname_cold_1();
  }
  return (char *)0x0;
}

Assistant:

char * nifti_makeimgname(const char * prefix, int nifti_type, int check,
                         int comp)
{
   char * iname;
   const char * ext;
   char   extnii[5] = ".nii";   /* modifiable, for possible uppercase */
   char   exthdr[5] = ".hdr";
   char   extimg[5] = ".img";
   char   extnia[5] = ".nia";
   char   extgz[5]  = ".gz";

   if( !nifti_validfilename(prefix) ) return NULL;

   /* add space for extension, optional ".gz", and null char */
   iname = (char *)calloc(sizeof(char),strlen(prefix)+8);
   if( !iname ){ fprintf(stderr,"** small malloc failure!\n"); return NULL; }
   strcpy(iname, prefix);

   /* use any valid extension */
   if( (ext = nifti_find_file_extension(iname)) != NULL ){
      /* if uppercase, convert all extensions */
      if( is_uppercase(ext) ) {
         make_uppercase(extnii);
         make_uppercase(exthdr);
         make_uppercase(extimg);
         make_uppercase(extnia);
         make_uppercase(extgz);
      }

      if( strncmp(ext,exthdr,4) == 0 )
      {
         memcpy(&(iname[strlen(iname)-strlen(ext)]),extimg,4);   /* then convert hdr name to img */
      }
   }
   /* otherwise, make one up */
   else if( nifti_type == NIFTI_FTYPE_NIFTI1_1 ) strcat(iname, extnii);
   else if( nifti_type == NIFTI_FTYPE_ASCII )    strcat(iname, extnia);
   else                                          strcat(iname, extimg);

#ifdef HAVE_ZLIB  /* if compression is requested, make sure of suffix */
   if( comp && (!ext || !strstr(iname,extgz)) ) strcat(iname,extgz);
#endif

   /* check for existence failure */
   if( check && nifti_fileexists(iname) ){
      fprintf(stderr,"** failure: image file '%s' already exists\n",iname);
      free(iname);
      return NULL;
   }

   if( g_opts.debug > 2 ) fprintf(stderr,"+d made image filename '%s'\n",iname);

   return iname;
}